

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

bool __thiscall QTextBrowser::focusNextPrevChild(QTextBrowser *this,bool next)

{
  bool bVar1;
  
  bVar1 = QWidgetTextControl::setFocusToNextOrPreviousAnchor
                    (*(QWidgetTextControl **)
                      (*(long *)&(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.
                                 super_QWidget.field_0x8 + 0x2f8),next);
  if (bVar1) {
    return true;
  }
  bVar1 = QTextEdit::focusNextPrevChild(&this->super_QTextEdit,next);
  return bVar1;
}

Assistant:

bool QTextBrowser::focusNextPrevChild(bool next)
{
    Q_D(QTextBrowser);
    if (d->control->setFocusToNextOrPreviousAnchor(next)) {
#ifdef QT_KEYPAD_NAVIGATION
        // Might need to synthesize a highlight event.
        if (d->prevFocus != d->control->textCursor() && d->control->textCursor().hasSelection()) {
            const QString href = d->control->anchorAtCursor();
            QUrl url = d->resolveUrl(href);
            emitHighlighted(url);
        }
        d->prevFocus = d->control->textCursor();
#endif
        return true;
    } else {
#ifdef QT_KEYPAD_NAVIGATION
        // We assume we have no highlight now.
        emitHighlighted(QUrl());
#endif
    }
    return QTextEdit::focusNextPrevChild(next);
}